

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O2

int __thiscall ReadData::decode(ReadData *this,int desc)

{
  BUFF *buff;
  int iVar1;
  uchar headbuff [25];
  
  buff = &this->databuff;
  iVar1 = ReadSocketData(this,buff,desc);
  if (iVar1 == 0) {
    ReadHead(this,buff,headbuff);
    iVar1 = ReadMessage(this,buff,headbuff);
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int ReadData::decode(int desc) {
    int flag;

    flag = ReadSocketData(databuff, desc);
    if(flag != 0)
        return flag;

    unsigned char headbuff[25];
    flag = ReadHead(databuff, headbuff);
    if(flag != 0)
        return flag;

    flag = ReadMessage(databuff, headbuff);
    return flag;
}